

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O1

void chirc_ctx_add_connection(chirc_ctx_t *ctx,chirc_connection_t *conn)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  chirc_connection_t *pcVar3;
  UT_hash_handle *pUVar4;
  UT_hash_bucket *pUVar5;
  UT_hash_handle *pUVar6;
  UT_hash_handle *pUVar7;
  UT_hash_table *pUVar8;
  UT_hash_bucket *pUVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  size_t __size;
  
  uVar10 = conn->socket + 0x112410dU ^ 0x7f76d;
  uVar11 = uVar10 << 8 ^ 0x9f49bac6 - uVar10;
  uVar12 = uVar11 >> 0xd ^ (-0x112410d - uVar10) - uVar11;
  uVar13 = uVar12 >> 0xc ^ (uVar10 - uVar11) - uVar12;
  uVar10 = uVar13 << 0x10 ^ (uVar11 - uVar12) - uVar13;
  uVar11 = uVar10 >> 5 ^ (uVar12 - uVar13) - uVar10;
  uVar12 = uVar11 >> 3 ^ (uVar13 - uVar10) - uVar11;
  uVar10 = uVar12 << 10 ^ (uVar10 - uVar11) - uVar12;
  uVar10 = uVar10 >> 0xf ^ uVar11 - (uVar12 + uVar10);
  pUVar1 = &conn->hh;
  (conn->hh).hashv = uVar10;
  (conn->hh).key = &conn->socket;
  (conn->hh).keylen = 4;
  pcVar3 = ctx->connections;
  if (pcVar3 == (chirc_connection_t *)0x0) {
    pUVar8 = (UT_hash_table *)malloc(0x40);
    (conn->hh).prev = (void *)0x0;
    (conn->hh).next = (void *)0x0;
    (conn->hh).tbl = pUVar8;
    if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00103820;
    *(undefined8 *)&pUVar8->num_items = 0;
    pUVar8->tail = (UT_hash_handle *)0x0;
    pUVar8->buckets = (UT_hash_bucket *)0x0;
    pUVar8->num_buckets = 0;
    pUVar8->log2_num_buckets = 0;
    pUVar8->hho = 0;
    pUVar8->ideal_chain_maxlen = 0;
    pUVar8->nonideal_items = 0;
    pUVar8->ineff_expands = 0;
    pUVar8->noexpand = 0;
    *(undefined8 *)&pUVar8->signature = 0;
    pUVar8->tail = pUVar1;
    pUVar8->num_buckets = 0x20;
    pUVar8->log2_num_buckets = 5;
    pUVar8->hho = 0x28;
    pUVar9 = (UT_hash_bucket *)malloc(0x200);
    pUVar8->buckets = pUVar9;
    pUVar8->signature = 0xa0111fe1;
    if (pUVar9 == (UT_hash_bucket *)0x0) goto LAB_00103820;
    memset(pUVar9,0,0x200);
    ctx->connections = conn;
  }
  else {
    (conn->hh).tbl = (pcVar3->hh).tbl;
    (conn->hh).next = (void *)0x0;
    pUVar8 = (pcVar3->hh).tbl;
    pUVar4 = pUVar8->tail;
    (conn->hh).prev = (void *)((long)pUVar4 - pUVar8->hho);
    pUVar4->next = conn;
    pUVar8->tail = pUVar1;
  }
  pUVar8 = (ctx->connections->hh).tbl;
  pUVar8->num_items = pUVar8->num_items + 1;
  uVar10 = pUVar8->num_buckets - 1 & uVar10;
  pUVar9 = pUVar8->buckets;
  uVar11 = pUVar9[uVar10].count + 1;
  pUVar9[uVar10].count = uVar11;
  pUVar4 = pUVar9[uVar10].hh_head;
  (conn->hh).hh_next = pUVar4;
  (conn->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar4 != (UT_hash_handle *)0x0) {
    pUVar4->hh_prev = pUVar1;
  }
  pUVar9[uVar10].hh_head = pUVar1;
  if ((pUVar9[uVar10].expand_mult * 10 + 10 <= uVar11) &&
     (pUVar8 = pUVar1->tbl, pUVar8->noexpand == 0)) {
    __size = (ulong)pUVar8->num_buckets << 5;
    pUVar9 = (UT_hash_bucket *)malloc(__size);
    if (pUVar9 == (UT_hash_bucket *)0x0) {
LAB_00103820:
      exit(-1);
    }
    uVar12 = 0;
    memset(pUVar9,0,__size);
    uVar10 = pUVar8->num_buckets;
    uVar13 = uVar10 * 2 - 1;
    uVar11 = ((pUVar8->num_items >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar13 & pUVar8->num_items) == 0);
    pUVar8->ideal_chain_maxlen = uVar11;
    pUVar8->nonideal_items = 0;
    if ((ulong)uVar10 != 0) {
      pUVar5 = pUVar8->buckets;
      uVar14 = 0;
      do {
        pUVar4 = pUVar5[uVar14].hh_head;
        while (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar6 = pUVar4->hh_next;
          uVar16 = pUVar4->hashv & uVar13;
          pUVar2 = pUVar9 + uVar16;
          uVar15 = pUVar9[uVar16].count + 1;
          pUVar9[uVar16].count = uVar15;
          if (uVar11 < uVar15) {
            pUVar8->nonideal_items = pUVar8->nonideal_items + 1;
            if (pUVar2->expand_mult * uVar11 < uVar15) {
              pUVar2->expand_mult = pUVar2->expand_mult + 1;
            }
          }
          pUVar4->hh_prev = (UT_hash_handle *)0x0;
          pUVar7 = pUVar2->hh_head;
          pUVar4->hh_next = pUVar7;
          if (pUVar7 != (UT_hash_handle *)0x0) {
            pUVar7->hh_prev = pUVar4;
          }
          pUVar2->hh_head = pUVar4;
          pUVar4 = pUVar6;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar10);
    }
    free(pUVar8->buckets);
    pUVar8 = pUVar1->tbl;
    pUVar8->num_buckets = pUVar8->num_buckets << 1;
    pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
    pUVar8->buckets = pUVar9;
    if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
      uVar12 = pUVar8->ineff_expands + 1;
    }
    pUVar8->ineff_expands = uVar12;
    if (1 < uVar12) {
      pUVar8->noexpand = 1;
    }
  }
  return;
}

Assistant:

void chirc_ctx_add_connection(chirc_ctx_t *ctx, chirc_connection_t *conn)
{
    HASH_ADD_INT(ctx->connections, socket, conn);
}